

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O3

shared_ptr<jessilib::parser> __thiscall jessilib::get_parser(jessilib *this,string *in_format)

{
  parser_manager *in_format_00;
  format_not_available *this_00;
  shared_ptr<jessilib::parser> sVar1;
  
  in_format_00 = impl::parser_manager::instance();
  sVar1 = impl::parser_manager::find_parser((parser_manager *)this,(string *)in_format_00);
  if (*(long *)this != 0) {
    sVar1.super___shared_ptr<jessilib::parser,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<jessilib::parser>)
           sVar1.super___shared_ptr<jessilib::parser,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (format_not_available *)__cxa_allocate_exception(0x10);
  format_not_available::format_not_available(this_00,in_format);
  __cxa_throw(this_00,&format_not_available::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::shared_ptr<parser> get_parser(const std::string& in_format) {
	auto parser = impl::parser_manager::instance().find_parser(in_format);
	if (parser == nullptr) {
		throw format_not_available{ in_format };
	}

	return parser;
}